

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O3

string * preprocessMacro_abi_cxx11_
                   (string *__return_storage_ptr__,char *text,MipsImmediateData *immediates)

{
  char **in_R8;
  Identifier labelName;
  undefined1 local_40 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  local_40._0_8_ = text;
  SymbolTable::getUniqueLabelName((Identifier *)(local_40 + 8),&Global.symbolTable,true);
  Expression::replaceMemoryPos(&(immediates->primary).expression,(Identifier *)(local_40 + 8));
  Expression::replaceMemoryPos(&(immediates->secondary).expression,(Identifier *)(local_40 + 8));
  tinyformat::format<Identifier,char_const*>
            (__return_storage_ptr__,(tinyformat *)"%s: %s",local_40 + 8,(Identifier *)local_40,in_R8
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._8_8_ != &local_28) {
    operator_delete((void *)local_40._8_8_,local_28._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string preprocessMacro(const char* text, MipsImmediateData& immediates)
{
	// A macro is turned into a sequence of opcodes that are parsed seperately.
	// Any expressions used in the macro may be evaluated at a different memory
	// position, so the '.' operator needs to be replaced by a label at the start
	// of the macro
	Identifier labelName = Global.symbolTable.getUniqueLabelName(true);
	immediates.primary.expression.replaceMemoryPos(labelName);
	immediates.secondary.expression.replaceMemoryPos(labelName);

	return tfm::format("%s: %s",labelName,text);
}